

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O3

bool __thiscall
fast_float::large_mul<(unsigned_short)62>
          (fast_float *this,stackvec<(unsigned_short)62> *x,limb_span y)

{
  ushort uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  limb_span y_00;
  
  y_00.length = y.ptr;
  if (y_00.length == (unsigned_long *)0x1) {
    uVar1 = *(ushort *)(this + 0x1f0);
    uVar8 = (ulong)uVar1;
    if (uVar8 != 0) {
      uVar2 = x->data[0];
      uVar9 = 0;
      uVar7 = 0;
      do {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar7;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar2;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)(this + uVar9 * 8);
        auVar5 = auVar3 * auVar4 + auVar5;
        uVar7 = auVar5._8_8_;
        *(long *)(this + uVar9 * 8) = auVar5._0_8_;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
      if (uVar7 != 0) {
        if (0x3d < uVar1) {
          return false;
        }
        *(ulong *)(this + uVar8 * 8) = uVar7;
        *(ushort *)(this + 0x1f0) = uVar1 + 1;
      }
    }
  }
  else {
    y_00.ptr = x->data;
    bVar6 = long_mul<(unsigned_short)62>((stackvec<(unsigned_short)62> *)this,y_00);
    if (!bVar6) {
      return false;
    }
  }
  return true;
}

Assistant:

FASTFLOAT_CONSTEXPR20
bool large_mul(stackvec<size>& x, limb_span y) noexcept {
  if (y.len() == 1) {
    FASTFLOAT_TRY(small_mul(x, y[0]));
  } else {
    FASTFLOAT_TRY(long_mul(x, y));
  }
  return true;
}